

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> * __thiscall
cmLocalNinjaGenerator::MakeCustomCommandGenerators
          (vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>
           *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmCustomCommand *cc,
          string *fileConfig)

{
  bool bVar1;
  PolicyStatus PVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  reference pbVar4;
  size_type sVar5;
  __normal_iterator<cmCustomCommandGenerator_*,_std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>_>
  local_110;
  const_iterator local_108;
  __normal_iterator<cmCustomCommandGenerator_*,_std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>_>
  local_100;
  __normal_iterator<cmCustomCommandGenerator_*,_std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>_>
  local_f8;
  const_iterator local_f0;
  cmLocalNinjaGenerator *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  string *config;
  iterator __end1_2;
  iterator __begin1_2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  string *byproduct;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string *output;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmLocalNinjaGenerator *local_40;
  undefined1 local_32;
  bool local_31;
  cmGlobalNinjaGenerator *pcStack_30;
  bool transformDepfile;
  cmGlobalNinjaGenerator *gg;
  string *fileConfig_local;
  cmCustomCommand *cc_local;
  cmLocalNinjaGenerator *this_local;
  vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_> *ccgs;
  
  gg = (cmGlobalNinjaGenerator *)fileConfig;
  fileConfig_local = (string *)cc;
  cc_local = (cmCustomCommand *)this;
  this_local = (cmLocalNinjaGenerator *)__return_storage_ptr__;
  pcStack_30 = GetGlobalNinjaGenerator(this);
  local_31 = false;
  PVar2 = cmCustomCommand::GetCMP0116Status((cmCustomCommand *)fileConfig_local);
  if (((PVar2 != OLD) && (PVar2 != WARN)) && (PVar2 - NEW < 3)) {
    local_31 = true;
  }
  local_32 = 0;
  std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::vector
            (__return_storage_ptr__);
  local_40 = this;
  std::vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>>::
  emplace_back<cmCustomCommand_const&,std::__cxx11::string_const&,cmLocalNinjaGenerator*,bool&>
            ((vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>> *)
             __return_storage_ptr__,(cmCustomCommand *)fileConfig_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gg,&local_40,
             &local_31);
  bVar1 = cmGlobalNinjaGenerator::EnableCrossConfigBuild(pcStack_30);
  if (bVar1) {
    pvVar3 = cmCustomCommand::GetOutputs_abi_cxx11_((cmCustomCommand *)fileConfig_local);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar3);
    output = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(pvVar3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&output), bVar1) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      sVar5 = cmGeneratorExpression::Find(pbVar4);
      if (sVar5 == 0xffffffffffffffff) {
        return __return_storage_ptr__;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    pvVar3 = cmCustomCommand::GetByproducts_abi_cxx11_((cmCustomCommand *)fileConfig_local);
    __end1_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar3);
    byproduct = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(pvVar3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_1,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&byproduct), bVar1) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_1);
      sVar5 = cmGeneratorExpression::Find(pbVar4);
      if (sVar5 == 0xffffffffffffffff) {
        return __return_storage_ptr__;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_1);
    }
    cmGlobalNinjaGenerator::GetCrossConfigs
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__begin1_2,pcStack_30,(string *)gg);
    __end1_2 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin1_2);
    config = (string *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin1_2);
    while (bVar1 = std::operator!=(&__end1_2,(_Self *)&config), bVar1) {
      local_e0 = std::
                 _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end1_2);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              gg,local_e0);
      if (bVar1) {
        local_e8 = this;
        std::vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>>::
        emplace_back<cmCustomCommand_const&,std::__cxx11::string_const&,cmLocalNinjaGenerator*,bool&,std::__cxx11::string_const&>
                  ((vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>> *)
                   __return_storage_ptr__,(cmCustomCommand *)fileConfig_local,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gg,&local_e8
                   ,&local_31,local_e0);
      }
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1_2);
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__begin1_2);
    bVar1 = anon_unknown.dwarf_7d4b2b::HasUniqueOutputs(__return_storage_ptr__);
    if (!bVar1) {
      local_100._M_current =
           (cmCustomCommandGenerator *)
           std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::begin
                     (__return_storage_ptr__);
      local_f8 = __gnu_cxx::
                 __normal_iterator<cmCustomCommandGenerator_*,_std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>_>
                 ::operator+(&local_100,1);
      __gnu_cxx::
      __normal_iterator<cmCustomCommandGenerator_const*,std::vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>>>
      ::__normal_iterator<cmCustomCommandGenerator*>
                ((__normal_iterator<cmCustomCommandGenerator_const*,std::vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>>>
                  *)&local_f0,&local_f8);
      local_110._M_current =
           (cmCustomCommandGenerator *)
           std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::end
                     (__return_storage_ptr__);
      __gnu_cxx::
      __normal_iterator<cmCustomCommandGenerator_const*,std::vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>>>
      ::__normal_iterator<cmCustomCommandGenerator*>
                ((__normal_iterator<cmCustomCommandGenerator_const*,std::vector<cmCustomCommandGenerator,std::allocator<cmCustomCommandGenerator>>>
                  *)&local_108,&local_110);
      std::vector<cmCustomCommandGenerator,_std::allocator<cmCustomCommandGenerator>_>::erase
                (__return_storage_ptr__,local_f0,local_108);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmCustomCommandGenerator>
cmLocalNinjaGenerator::MakeCustomCommandGenerators(
  cmCustomCommand const& cc, std::string const& fileConfig)
{
  cmGlobalNinjaGenerator const* gg = this->GetGlobalNinjaGenerator();

  bool transformDepfile = false;
  switch (cc.GetCMP0116Status()) {
    case cmPolicies::WARN:
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      transformDepfile = true;
      break;
  }

  // Start with the build graph's configuration.
  std::vector<cmCustomCommandGenerator> ccgs;
  ccgs.emplace_back(cc, fileConfig, this, transformDepfile);

  // Consider adding cross configurations.
  if (!gg->EnableCrossConfigBuild()) {
    return ccgs;
  }

  // Outputs and byproducts must be expressed using generator expressions.
  for (std::string const& output : cc.GetOutputs()) {
    if (cmGeneratorExpression::Find(output) == std::string::npos) {
      return ccgs;
    }
  }
  for (std::string const& byproduct : cc.GetByproducts()) {
    if (cmGeneratorExpression::Find(byproduct) == std::string::npos) {
      return ccgs;
    }
  }

  // Tentatively add the other cross configurations.
  for (std::string const& config : gg->GetCrossConfigs(fileConfig)) {
    if (fileConfig != config) {
      ccgs.emplace_back(cc, fileConfig, this, transformDepfile, config);
    }
  }

  // If outputs and byproducts are not unique to each configuration,
  // drop the cross configurations.
  if (!HasUniqueOutputs(ccgs)) {
    ccgs.erase(ccgs.begin() + 1, ccgs.end());
  }

  return ccgs;
}